

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O1

int executeLoadManifestCommand
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,bool loadOnly)

{
  uint uVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  StringRef filename_00;
  StringRef workingDirectory_00;
  pointer ppVar4;
  SmallString<10240U> *pSVar5;
  basic *pbVar6;
  iterator __position;
  iterator iVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ManifestLoaderImpl *pMVar11;
  pointer ppCVar12;
  pointer ppCVar13;
  _Head_base<0UL,_llbuild::ninja::ManifestLoader::ManifestLoaderImpl_*,_false> _Var14;
  pointer pbVar15;
  undefined4 uVar16;
  byte bVar17;
  int iVar18;
  pointer pbVar19;
  long lVar20;
  ostream *poVar21;
  ulong uVar22;
  basic *pbVar23;
  uint uVar24;
  pointer pbVar25;
  pointer ppVar26;
  undefined8 extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_13;
  uint uVar27;
  Node **node;
  _Alloc_hider _Var28;
  vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *__range2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  basic *pbVar29;
  undefined7 in_register_00000031;
  char *pcVar30;
  string *this;
  Node **node_2;
  long *plVar31;
  undefined4 uVar32;
  long *plVar33;
  __normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
  __i;
  long lVar34;
  Pool **ppPVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  error_code eVar37;
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  StringRef str_02;
  StringRef str_03;
  StringRef str_04;
  StringRef str_05;
  vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> pools_1;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> commands;
  vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> rules;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bindings;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_> manifest;
  string filename;
  string workingDirectory;
  ManifestLoader loader;
  SmallString<128U> current_dir;
  LoadManifestActions actions;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  basic *local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ManifestLoaderImpl *local_1a0;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> local_198;
  string local_178;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  _Head_base<0UL,_llbuild::ninja::ManifestLoader::ManifestLoaderImpl_*,_false> local_138;
  long *local_130;
  size_t local_128;
  long local_120 [2];
  char *local_110;
  size_t local_108;
  char local_100;
  undefined7 uStack_ff;
  ManifestLoader local_f0;
  SmallVectorImpl<char> local_e8;
  long local_d8 [16];
  ManifestLoaderActions local_58;
  undefined8 local_50;
  undefined8 local_48;
  StringRef local_40;
  
  pbVar25 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar25 == pbVar19) || (pbVar25->_M_string_length == 0)) {
    uVar32 = 0;
    pbVar23 = (basic *)CONCAT71(in_register_00000031,loadOnly);
  }
  else {
    local_1d0 = (basic *)CONCAT44(local_1d0._4_4_,(int)CONCAT71(in_register_00000031,loadOnly));
    uVar32 = 0;
    pbVar15 = pbVar25;
    do {
      pbVar25 = pbVar15;
      pbVar23 = local_1d0;
      if (*(pbVar25->_M_dataplus)._M_p != '-') goto LAB_001207e6;
      pcVar2 = (pbVar25->_M_dataplus)._M_p;
      local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar2,pcVar2 + pbVar25->_M_string_length);
      iVar18 = std::__cxx11::string::compare((char *)&local_e8);
      uVar16 = (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      if (iVar18 != 0) {
        executeLoadManifestCommand();
        uVar16 = uVar32;
      }
      uVar32 = uVar16;
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_d8) {
        operator_delete(local_e8.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                        local_d8[0] + 1);
      }
      if (iVar18 != 0) {
        return 1;
      }
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while ((pbVar25 + 1 != pbVar19) && (pbVar15 = pbVar25 + 1, pbVar25[1]._M_string_length != 0));
    pbVar25 = pbVar25 + 1;
    pbVar23 = local_1d0;
  }
LAB_001207e6:
  if (pbVar25 == pbVar19) {
    executeLoadManifestCommand();
    return 1;
  }
  local_1d0 = (basic *)CONCAT44(local_1d0._4_4_,uVar32);
  local_130 = local_120;
  pcVar2 = (pbVar25->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar2,pcVar2 + pbVar25->_M_string_length);
  if (pbVar25 + 1 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar20 = std::__cxx11::string::rfind((char)&local_130,0x2f);
    if (lVar20 != -1) {
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_130);
      iVar18 = llbuild::basic::sys::chdir
                         ((char *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  BeginX);
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_d8) {
        operator_delete(local_e8.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                        local_d8[0] + 1);
      }
      if ((char)iVar18 == '\0') {
        executeLoadManifestCommand();
        goto LAB_00122bab;
      }
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_130);
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_e8);
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_d8) {
        operator_delete(local_e8.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                        local_d8[0] + 1);
      }
    }
    local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_d8;
    local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x80;
    eVar37 = llvm::sys::fs::current_path(&local_e8);
    if (eVar37._M_value == 0) {
      local_110 = &local_100;
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
          (long *)0x0) {
        local_108 = 0;
        local_100 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   local_e8.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   (long)local_e8.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   (local_e8.super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                   0xffffffff));
      }
      local_58._vptr_ManifestLoaderActions = (_func_int **)&PTR__ManifestLoaderActions_002115a8;
      local_50 = 0;
      local_48 = 0x1400000000;
      workingDirectory_00.Length = local_108;
      workingDirectory_00.Data = local_110;
      filename_00.Length = local_128;
      filename_00.Data = (char *)local_130;
      llbuild::ninja::ManifestLoader::ManifestLoader
                (&local_f0,workingDirectory_00,filename_00,&local_58);
      llbuild::ninja::ManifestLoader::load((ManifestLoader *)&local_138);
      plVar33 = local_130;
      _Var14._M_head_impl = local_138._M_head_impl;
      if ((char)pbVar23 == '\0') {
        local_1a0 = local_138._M_head_impl;
        if (((ulong)local_1d0 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Loaded Manifest: \"",0x14);
          local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
          if (plVar33 == (long *)0x0) {
            local_218.first._M_string_length = 0;
            local_218.first.field_2._M_allocated_capacity =
                 local_218.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_218,plVar33,(char *)((long)plVar33 + local_128));
          }
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                               local_218.first._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
            operator_delete(local_218.first._M_dataplus._M_p,
                            local_218.first.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Top-Level Bindings\n",0x15);
          if (*(long *)(((_Var14._M_head_impl)->includeStack).
                        super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                        .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 8) != 0) {
            __assert_fail("manifest->getRootScope().getParent() == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                          ,0x1d4,"void dumpNinjaManifestText(StringRef, ninja::Manifest *)");
          }
          local_1c8._0_8_ = (basic *)0x0;
          local_1c8._8_8_ = (basic *)0x0;
          local_1b8._M_allocated_capacity = 0;
          plVar33 = *(long **)(((_Var14._M_head_impl)->includeStack).
                               super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                               .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 0x10);
          pbVar23 = (basic *)(ulong)*(uint *)((_Var14._M_head_impl)->includeStack).
                                             super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                             .InlineElts[2].super_AlignedCharArray<8UL,_24UL>.buffer
          ;
          plVar31 = plVar33;
          if (pbVar23 != (basic *)0x0) {
            for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
            }
          }
          plVar33 = plVar33 + (long)pbVar23;
          if (plVar31 != plVar33) {
            do {
              puVar3 = (undefined8 *)*plVar31;
              local_178._M_dataplus._M_p = (pointer)(puVar3 + 5);
              pbVar23 = (basic *)*puVar3;
              local_178._M_string_length = (size_type)pbVar23;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<llvm::StringRef,_true>
                        (&local_218,(StringRef *)&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar3 + 1));
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)local_1c8,&local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.second._M_dataplus._M_p != &local_218.second.field_2) {
                operator_delete(local_218.second._M_dataplus._M_p,
                                local_218.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              do {
                do {
                  plVar31 = plVar31 + 1;
                } while (*plVar31 == 0);
              } while (*plVar31 == -8);
            } while (plVar31 != plVar33);
          }
          uVar10 = local_1c8._8_8_;
          uVar9 = local_1c8._0_8_;
          pbVar29 = (basic *)local_1c8._0_8_;
          pbVar6 = (basic *)local_1c8._8_8_;
          if (local_1c8._0_8_ != local_1c8._8_8_) {
            uVar22 = (long)(local_1c8._8_8_ - local_1c8._0_8_) >> 6;
            lVar20 = 0x3f;
            if (uVar22 != 0) {
              for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (uVar9,uVar10);
            pbVar29 = (basic *)local_1c8._0_8_;
            pbVar6 = (basic *)local_1c8._8_8_;
          }
          for (; uVar9 = local_1c8._8_8_, pbVar29 != (basic *)local_1c8._8_8_;
              pbVar29 = pbVar29 + 0x40) {
            local_1c8._8_8_ = pbVar6;
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,*(char **)pbVar29,*(long *)(pbVar29 + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar21," = \"",4);
            str.Length = (size_t)pbVar23;
            str.Data = *(char **)(pbVar29 + 0x28);
            llbuild::commands::util::escapedString_abi_cxx11_
                      (&local_218.first,*(util **)(pbVar29 + 0x20),str);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar21,local_218.first._M_dataplus._M_p,
                                 local_218.first._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
              operator_delete(local_218.first._M_dataplus._M_p,
                              local_218.first.field_2._M_allocated_capacity + 1);
            }
            pbVar6 = (basic *)local_1c8._8_8_;
            local_1c8._8_8_ = uVar9;
          }
          local_1c8._8_8_ = pbVar6;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          pMVar11 = local_1a0;
          if (*(int *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                       super_SmallVectorStorage<char,_10240U>.InlineElts + 0x3c) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Pools\n",8);
            local_218.first._M_dataplus._M_p = (pointer)0x0;
            local_218.first._M_string_length = 0;
            local_218.first.field_2._M_allocated_capacity = 0;
            plVar33 = *(long **)&(pMVar11->buildCommand).super_SmallVector<char,_10240U>.
                                 super_SmallVectorStorage<char,_10240U>.InlineElts[0x30].
                                 super_AlignedCharArray<1UL,_1UL>;
            uVar22 = (ulong)*(uint *)((pMVar11->buildCommand).super_SmallVector<char,_10240U>.
                                      super_SmallVectorStorage<char,_10240U>.InlineElts + 0x38);
            plVar31 = plVar33;
            if (uVar22 != 0) {
              for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
              }
            }
            _Var28._M_p = local_218.first._M_dataplus._M_p;
            __position._M_current = (Pool **)local_218.first._M_string_length;
            while (local_218.first._M_dataplus._M_p = _Var28._M_p,
                  local_218.first._M_string_length = (size_type)__position._M_current,
                  plVar31 != plVar33 + uVar22) {
              if (__position._M_current == (Pool **)local_218.first.field_2._M_allocated_capacity) {
                std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>::
                _M_realloc_insert<llbuild::ninja::Pool*const&>
                          ((vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>> *)
                           &local_218,__position,(Pool **)(*plVar31 + 8));
              }
              else {
                *__position._M_current = *(Pool **)(*plVar31 + 8);
                local_218.first._M_string_length = (size_type)(__position._M_current + 1);
              }
              do {
                do {
                  plVar31 = plVar31 + 1;
                } while (*plVar31 == 0);
                _Var28._M_p = local_218.first._M_dataplus._M_p;
                __position._M_current = (Pool **)local_218.first._M_string_length;
              } while (*plVar31 == -8);
            }
            iVar7._M_current = __position._M_current;
            if ((Pool **)_Var28._M_p != __position._M_current) {
              uVar22 = (long)__position._M_current - (long)_Var28._M_p >> 3;
              lVar20 = 0x3f;
              if (uVar22 != 0) {
                for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                        (_Var28._M_p,__position._M_current,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
              if ((long)__position._M_current - (long)_Var28._M_p < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (_Var28._M_p,__position._M_current);
                _Var28._M_p = local_218.first._M_dataplus._M_p;
                iVar7._M_current = (Pool **)local_218.first._M_string_length;
              }
              else {
                ppPVar35 = (Pool **)(_Var28._M_p + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (_Var28._M_p,ppPVar35);
                for (; _Var28._M_p = local_218.first._M_dataplus._M_p,
                    iVar7._M_current = (Pool **)local_218.first._M_string_length,
                    ppPVar35 != __position._M_current; ppPVar35 = ppPVar35 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (ppPVar35);
                }
              }
            }
            for (; sVar8 = local_218.first._M_string_length,
                _Var28._M_p != (pointer)local_218.first._M_string_length;
                _Var28._M_p = (pointer)((long)_Var28._M_p + 8)) {
              local_218.first._M_string_length = (size_type)iVar7._M_current;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pool ",5);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   ((*(Pool **)_Var28._M_p)->name)._M_dataplus._M_p,
                                   ((*(Pool **)_Var28._M_p)->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
              if ((*(Pool **)_Var28._M_p)->depth != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  depth = ",10);
                poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              iVar7._M_current = (Pool **)local_218.first._M_string_length;
              local_218.first._M_string_length = sVar8;
            }
            local_218.first._M_string_length = (size_type)iVar7._M_current;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218.first._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_218.first._M_dataplus._M_p,
                              local_218.first.field_2._M_allocated_capacity -
                              (long)local_218.first._M_dataplus._M_p);
            }
          }
          pMVar11 = local_1a0;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Rules\n",8);
          local_178._M_dataplus._M_p = (pointer)0x0;
          local_178._M_string_length = 0;
          local_178.field_2._M_allocated_capacity = 0;
          plVar33 = *(long **)(pMVar11->includeStack).
                              super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                              .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer;
          ppVar26 = (pointer)(ulong)*(uint *)((pMVar11->includeStack).
                                              super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                              .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.
                                              buffer + 8);
          plVar31 = plVar33;
          if (ppVar26 != (pointer)0x0) {
            for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
            }
          }
          plVar33 = plVar33 + (long)ppVar26;
          if (plVar31 != plVar33) {
            do {
              if (local_178._M_string_length == local_178.field_2._M_allocated_capacity) {
                std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>::
                _M_realloc_insert<llbuild::ninja::Rule*const&>
                          ((vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>> *)
                           &local_178,(iterator)local_178._M_string_length,(Rule **)(*plVar31 + 8));
              }
              else {
                *(Rule **)local_178._M_string_length = *(Rule **)(*plVar31 + 8);
                local_178._M_string_length = local_178._M_string_length + 8;
              }
              do {
                do {
                  plVar31 = plVar31 + 1;
                } while (*plVar31 == 0);
              } while (*plVar31 == -8);
            } while (plVar31 != plVar33);
          }
          sVar8 = local_178._M_string_length;
          _Var28._M_p = local_178._M_dataplus._M_p;
          if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
            lVar34 = local_178._M_string_length - (long)local_178._M_dataplus._M_p;
            uVar22 = lVar34 >> 3;
            lVar20 = 0x3f;
            if (uVar22 != 0) {
              for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                      (local_178._M_dataplus._M_p,local_178._M_string_length,
                       ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar34 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (_Var28._M_p,sVar8);
            }
            else {
              pbVar23 = (basic *)(_Var28._M_p + 0x80);
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (_Var28._M_p,pbVar23);
              for (; pbVar23 != (basic *)sVar8; pbVar23 = pbVar23 + 8) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (pbVar23);
              }
            }
          }
          local_178.field_2._8_8_ = local_178._M_string_length;
          if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
            _Var28._M_p = local_178._M_dataplus._M_p;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rule ",5);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)**(undefined8 **)_Var28._M_p,
                                   (*(undefined8 **)_Var28._M_p)[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              plVar33 = *(long **)(*(long *)_Var28._M_p + 0x20);
              ppVar26 = (pointer)(ulong)*(uint *)(*(long *)_Var28._M_p + 0x28);
              plVar31 = plVar33;
              if (ppVar26 != (pointer)0x0) {
                for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
                }
              }
              plVar33 = plVar33 + (long)ppVar26;
              local_1d0 = (basic *)_Var28._M_p;
              while (ppCVar13 = local_198.
                                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                    ppCVar12 = local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_start, plVar31 != plVar33) {
                puVar3 = (undefined8 *)*plVar31;
                local_158.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)(puVar3 + 5);
                ppVar26 = (pointer)*puVar3;
                local_158.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar26;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<llvm::StringRef,_true>
                          (&local_218,(StringRef *)&local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (puVar3 + 1));
                std::
                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                            *)&local_198,&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.second._M_dataplus._M_p != &local_218.second.field_2) {
                  operator_delete(local_218.second._M_dataplus._M_p,
                                  local_218.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
                do {
                  do {
                    plVar31 = plVar31 + 1;
                  } while (*plVar31 == 0);
                } while (*plVar31 == -8);
              }
              pbVar29 = (basic *)local_198.
                                 super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
              pbVar23 = (basic *)local_198.
                                 super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
              if (local_198.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_198.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar22 = (long)local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 6;
                lVar20 = 0x3f;
                if (uVar22 != 0) {
                  for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (ppCVar12,ppCVar13);
                pbVar29 = (basic *)local_198.
                                   super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                pbVar23 = (basic *)local_198.
                                   super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
              }
              for (; pbVar29 != pbVar23; pbVar29 = pbVar29 + 0x40) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,*(char **)pbVar29,*(long *)(pbVar29 + 8))
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar21," = \"",4);
                str_00.Length = (size_t)ppVar26;
                str_00.Data = *(char **)(pbVar29 + 0x28);
                llbuild::commands::util::escapedString_abi_cxx11_
                          (&local_218.first,*(util **)(pbVar29 + 0x20),str_00);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar21,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_198);
              _Var28._M_p = (pointer)(local_1d0 + 8);
            } while (_Var28._M_p != (pointer)local_178.field_2._8_8_);
          }
          std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
                    (&local_198,
                     (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                         super_SmallVectorStorage<char,_10240U>.InlineElts + 0x18));
          ppCVar13 = local_198.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppCVar12 = local_198.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar34 = (long)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = lVar34 >> 3;
            lVar20 = 0x3f;
            if (uVar22 != 0) {
              for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                      (local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar34 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (ppCVar12,ppCVar13);
            }
            else {
              pbVar23 = (basic *)((long)ppCVar12 + 0x80);
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (ppCVar12,pbVar23);
              for (; pbVar23 != (basic *)ppCVar13; pbVar23 = pbVar23 + 8) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (pbVar23);
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Commands\n",0xb);
          local_1d0 = (basic *)local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          pbVar23 = (basic *)local_198.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"build",5);
              plVar31 = *(long **)(*(long *)pbVar23 + 0x18);
              for (plVar33 = *(long **)(*(long *)pbVar23 + 0x10); plVar33 != plVar31;
                  plVar33 = plVar33 + 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \"",2);
                str_01.Length = (size_t)ppVar26;
                str_01.Data = *(char **)(*plVar33 + 0x28);
                llbuild::commands::util::escapedString_abi_cxx11_
                          (&local_218.first,*(util **)(*plVar33 + 0x20),str_01);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)**(undefined8 **)(*(long *)pbVar23 + 8),
                         (*(undefined8 **)(*(long *)pbVar23 + 8))[1]);
              plVar33 = *(long **)(*(long *)pbVar23 + 0x28);
              plVar31 = *(long **)(*(long *)pbVar23 + 0x30);
              if (plVar33 != plVar31) {
                uVar27 = 0;
                do {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                  uVar1 = *(uint *)(*(long *)pbVar23 + 0x40);
                  uVar24 = *(int *)(*(long *)pbVar23 + 0x44) + uVar1;
                  ppVar26 = (pointer)(ulong)uVar24;
                  if (uVar27 == uVar24) {
                    lVar20 = 3;
                    pcVar30 = "|| ";
LAB_00121e35:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar30,lVar20);
                  }
                  else if (uVar27 == uVar1) {
                    lVar20 = 2;
                    pcVar30 = "| ";
                    goto LAB_00121e35;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                  str_02.Length = (size_t)ppVar26;
                  str_02.Data = *(char **)(*plVar33 + 0x28);
                  llbuild::commands::util::escapedString_abi_cxx11_
                            (&local_218.first,*(util **)(*plVar33 + 0x20),str_02);
                  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                       local_218.first._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                    operator_delete(local_218.first._M_dataplus._M_p,
                                    local_218.first.field_2._M_allocated_capacity + 1);
                  }
                  uVar27 = uVar27 + 1;
                  plVar33 = plVar33 + 1;
                } while (plVar33 != plVar31);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  command = \"",0xd);
              str_03.Length = (size_t)ppVar26;
              str_03.Data = *(char **)(*(long *)pbVar23 + 0x78);
              llbuild::commands::util::escapedString_abi_cxx11_
                        (&local_218.first,*(util **)(*(long *)pbVar23 + 0x70),str_03);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  description = \"",0x11);
              str_04.Length = (size_t)ppVar26;
              str_04.Data = *(char **)(*(long *)pbVar23 + 0x98);
              llbuild::commands::util::escapedString_abi_cxx11_
                        (&local_218.first,*(util **)(*(long *)pbVar23 + 0x90),str_04);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              bVar17 = *(byte *)(*(long *)pbVar23 + 0x110) & 3;
              if (bVar17 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  deps = gcc\n",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  depfile = \"",0xd);
                str_05.Length = (size_t)ppVar26;
                str_05.Data = *(char **)(*(long *)pbVar23 + 0xb8);
                llbuild::commands::util::escapedString_abi_cxx11_
                          (&local_218.first,*(util **)(*(long *)pbVar23 + 0xb0),str_05);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              else if (bVar17 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  deps = msvc\n",0xe);
              }
              if ((*(byte *)(*(long *)pbVar23 + 0x110) & 4) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  generator = 1\n",0x10);
              }
              if ((*(byte *)(*(long *)pbVar23 + 0x110) & 8) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  restat = 1\n",0xd);
              }
              puVar3 = *(undefined8 **)(*(long *)pbVar23 + 0x68);
              if (puVar3 != (undefined8 *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  pool = ",9);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              pbVar23 = pbVar23 + 8;
            } while (pbVar23 != local_1d0);
          }
          if (*(long *)&(local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts[0x50].
                        super_AlignedCharArray<1UL,_1UL> !=
              *(long *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x58)) {
            pSVar5 = &local_1a0->buildCommand;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# Default Targets\n",0x12);
            std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
                      ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       &local_218,
                       (vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       ((pSVar5->super_SmallVector<char,_10240U>).
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x50));
            sVar8 = local_218.first._M_string_length;
            _Var28._M_p = local_218.first._M_dataplus._M_p;
            if (local_218.first._M_dataplus._M_p != (pointer)local_218.first._M_string_length) {
              lVar34 = local_218.first._M_string_length - (long)local_218.first._M_dataplus._M_p;
              uVar22 = lVar34 >> 3;
              lVar20 = 0x3f;
              if (uVar22 != 0) {
                for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (local_218.first._M_dataplus._M_p,local_218.first._M_string_length,
                         ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar34 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (_Var28._M_p,sVar8);
              }
              else {
                paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(_Var28._M_p + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (_Var28._M_p,paVar36);
                for (; paVar36 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)sVar8;
                    paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(&paVar36->_M_allocated_capacity + 1)) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                            (paVar36);
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"default ",8);
            sVar8 = local_218.first._M_string_length;
            for (_Var28._M_p = local_218.first._M_dataplus._M_p; _Var28._M_p != (pointer)sVar8;
                _Var28._M_p = _Var28._M_p + 8) {
              if (*(Pool **)_Var28._M_p != *(Pool **)local_218.first._M_dataplus._M_p) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,*(char **)&(*(Pool **)_Var28._M_p)->depth,
                                   (long)(*(Pool **)_Var28._M_p)[1].name._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218.first._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_218.first._M_dataplus._M_p,
                              local_218.first.field_2._M_allocated_capacity -
                              (long)local_218.first._M_dataplus._M_p);
            }
          }
          if ((basic *)local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start != (basic *)0x0) {
            operator_delete(local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((basic *)local_178._M_dataplus._M_p != (basic *)0x0) {
            operator_delete(local_178._M_dataplus._M_p,
                            local_178.field_2._M_allocated_capacity -
                            (long)local_178._M_dataplus._M_p);
          }
          this = (string *)local_1c8;
        }
        else {
          local_40.Data = (char *)local_130;
          local_40.Length = local_128;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"filename\": \"",0xf);
          llbuild::basic::escapeForJSON<llvm::StringRef>(&local_218.first,&local_40);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                               local_218.first._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\",\n",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
            operator_delete(local_218.first._M_dataplus._M_p,
                            local_218.first.field_2._M_allocated_capacity + 1);
          }
          if (*(long *)((local_1a0->includeStack).
                        super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                        .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 8) != 0) {
            __assert_fail("manifest->getRootScope().getParent() == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                          ,0x263,"void dumpNinjaManifestJSON(StringRef, ninja::Manifest *)");
          }
          local_178._M_dataplus._M_p = (pointer)0x0;
          local_178._M_string_length = 0;
          local_178.field_2._M_allocated_capacity = 0;
          plVar33 = *(long **)((local_1a0->includeStack).
                               super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                               .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 0x10);
          uVar22 = (ulong)*(uint *)(local_1a0->includeStack).
                                   super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                   .InlineElts[2].super_AlignedCharArray<8UL,_24UL>.buffer;
          plVar31 = plVar33;
          if (uVar22 != 0) {
            for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
            }
          }
          if (plVar31 != plVar33 + uVar22) {
            do {
              puVar3 = (undefined8 *)*plVar31;
              local_1c8._0_8_ = puVar3 + 5;
              local_1c8._8_8_ = *puVar3;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<llvm::StringRef,_true>
                        (&local_218,(StringRef *)local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar3 + 1));
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_178,&local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.second._M_dataplus._M_p != &local_218.second.field_2) {
                operator_delete(local_218.second._M_dataplus._M_p,
                                local_218.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              do {
                do {
                  plVar31 = plVar31 + 1;
                } while (*plVar31 == 0);
              } while (*plVar31 == -8);
            } while (plVar31 != plVar33 + uVar22);
          }
          sVar8 = local_178._M_string_length;
          _Var28._M_p = local_178._M_dataplus._M_p;
          if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
            uVar22 = (long)(local_178._M_string_length - (long)local_178._M_dataplus._M_p) >> 6;
            lVar20 = 0x3f;
            if (uVar22 != 0) {
              for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_178._M_dataplus._M_p,local_178._M_string_length,
                       ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var28._M_p,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"bindings\": {\n",0x10);
          sVar8 = local_178._M_string_length;
          if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
            _Var28._M_p = local_178._M_dataplus._M_p;
            do {
              if (_Var28._M_p != local_178._M_dataplus._M_p) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \"",5);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_218.first,(basic *)_Var28._M_p,in);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\": \"",4);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)local_1c8,(basic *)_Var28._M_p + 0x20,in_00);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar21,(char *)local_1c8._0_8_,local_1c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
              if ((basic *)local_1c8._0_8_ != (basic *)(local_1c8 + 0x10)) {
                operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              _Var28._M_p = _Var28._M_p + 0x40;
            } while (_Var28._M_p != (pointer)sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  },\n",6);
          if (*(int *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                       super_SmallVectorStorage<char,_10240U>.InlineElts + 0x3c) != 0) {
            local_1c8._0_8_ = (basic *)0x0;
            local_1c8._8_8_ = (basic *)0x0;
            local_1b8._M_allocated_capacity = 0;
            plVar33 = *(long **)&(local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                                 super_SmallVectorStorage<char,_10240U>.InlineElts[0x30].
                                 super_AlignedCharArray<1UL,_1UL>;
            uVar22 = (ulong)*(uint *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                                      super_SmallVectorStorage<char,_10240U>.InlineElts + 0x38);
            plVar31 = plVar33;
            if (uVar22 != 0) {
              for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
              }
            }
            if (plVar31 != plVar33 + uVar22) {
              do {
                if (local_1c8._8_8_ == local_1b8._M_allocated_capacity) {
                  std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>::
                  _M_realloc_insert<llbuild::ninja::Pool*const&>
                            ((vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>> *)
                             local_1c8,(iterator)local_1c8._8_8_,(Pool **)(*plVar31 + 8));
                }
                else {
                  *(Pool **)local_1c8._8_8_ = *(Pool **)(*plVar31 + 8);
                  local_1c8._8_8_ = local_1c8._8_8_ + 8;
                }
                do {
                  do {
                    plVar31 = plVar31 + 1;
                  } while (*plVar31 == 0);
                } while (*plVar31 == -8);
              } while (plVar31 != plVar33 + uVar22);
            }
            uVar10 = local_1c8._8_8_;
            uVar9 = local_1c8._0_8_;
            if (local_1c8._0_8_ != local_1c8._8_8_) {
              lVar34 = local_1c8._8_8_ - local_1c8._0_8_;
              uVar22 = lVar34 >> 3;
              lVar20 = 0x3f;
              if (uVar22 != 0) {
                for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                        (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar34 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (uVar9,uVar10);
              }
              else {
                pbVar23 = (basic *)(uVar9 + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (uVar9,pbVar23);
                for (; pbVar23 != (basic *)uVar10; pbVar23 = pbVar23 + 8) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (pbVar23);
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  \"pools\": {\n",0xd);
            uVar9 = local_1c8._8_8_;
            for (pbVar23 = (basic *)local_1c8._0_8_; pbVar23 != (basic *)uVar9;
                pbVar23 = pbVar23 + 8) {
              pbVar29 = *(basic **)pbVar23;
              if (pbVar23 != (basic *)local_1c8._0_8_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \"",5);
              llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_218.first,pbVar29,in_01);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\": {",4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              if (*(int *)(pbVar29 + 0x20) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n      \"depth\": ",0x10);
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n    }",6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  },\n",6);
            if ((basic *)local_1c8._0_8_ != (basic *)0x0) {
              operator_delete((void *)local_1c8._0_8_,
                              local_1b8._M_allocated_capacity - local_1c8._0_8_);
            }
          }
          local_198.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_198.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_198.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          plVar33 = *(long **)(local_1a0->includeStack).
                              super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                              .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer;
          uVar22 = (ulong)*(uint *)((local_1a0->includeStack).
                                    super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                    .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer + 8);
          plVar31 = plVar33;
          if (uVar22 != 0) {
            for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
            }
          }
          if (plVar31 != plVar33 + uVar22) {
            do {
              if (local_198.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_198.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>::
                _M_realloc_insert<llbuild::ninja::Rule*const&>
                          ((vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>> *)
                           &local_198,
                           (iterator)
                           local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Rule **)(*plVar31 + 8));
              }
              else {
                *local_198.
                 super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = (Command *)*(Rule **)(*plVar31 + 8);
                local_198.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_198.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              do {
                do {
                  plVar31 = plVar31 + 1;
                } while (*plVar31 == 0);
              } while (*plVar31 == -8);
            } while (plVar31 != plVar33 + uVar22);
          }
          ppCVar13 = local_198.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppCVar12 = local_198.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar34 = (long)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = lVar34 >> 3;
            lVar20 = 0x3f;
            if (uVar22 != 0) {
              for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                      (local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar34 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (ppCVar12,ppCVar13);
            }
            else {
              pbVar23 = (basic *)((long)ppCVar12 + 0x80);
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (ppCVar12,pbVar23);
              for (; pbVar23 != (basic *)ppCVar13; pbVar23 = pbVar23 + 8) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (pbVar23);
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"rules\": {\n",0xd);
          local_178.field_2._8_8_ =
               local_198.
               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar23 = (basic *)local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
            do {
              pbVar29 = *(basic **)pbVar23;
              local_1d0 = pbVar23;
              if (pbVar23 !=
                  (basic *)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \"",5);
              llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_218.first,pbVar29,in_02);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\": {\n",5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              local_158.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_158.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_158.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              plVar33 = *(long **)(pbVar29 + 0x20);
              uVar27 = *(uint *)(pbVar29 + 0x28);
              plVar31 = plVar33;
              if ((ulong)uVar27 != 0) {
                for (; (*plVar31 == 0 || (*plVar31 == -8)); plVar31 = plVar31 + 1) {
                }
              }
              while (ppVar4 = local_158.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                    ppVar26 = local_158.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start, plVar31 != plVar33 + uVar27
                    ) {
                puVar3 = (undefined8 *)*plVar31;
                local_1c8._0_8_ = puVar3 + 5;
                local_1c8._8_8_ = *puVar3;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<llvm::StringRef,_true>
                          (&local_218,(StringRef *)local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (puVar3 + 1));
                std::
                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                            *)&local_158,&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.second._M_dataplus._M_p != &local_218.second.field_2) {
                  operator_delete(local_218.second._M_dataplus._M_p,
                                  local_218.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
                do {
                  do {
                    plVar31 = plVar31 + 1;
                  } while (*plVar31 == 0);
                } while (*plVar31 == -8);
              }
              if (local_158.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_158.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar22 = (long)local_158.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_158.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 6;
                lVar20 = 0x3f;
                if (uVar22 != 0) {
                  for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_158.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_158.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (ppVar26,ppVar4);
                ppVar26 = local_158.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar4 = local_158.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              }
              for (; ppVar26 != ppVar4; ppVar26 = ppVar26 + 1) {
                if (ppVar26 !=
                    local_158.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"",7);
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          (&local_218.first,(basic *)ppVar26,in_03);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\": \"",4);
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          ((string *)local_1c8,(basic *)&ppVar26->second,in_04);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar21,(char *)local_1c8._0_8_,local_1c8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                if ((basic *)local_1c8._0_8_ != (basic *)(local_1c8 + 0x10)) {
                  operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n    }",6);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_158);
              pbVar23 = local_1d0 + 8;
            } while (pbVar23 != (basic *)local_178.field_2._8_8_);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  },\n",6);
          if (*(long *)&(local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts[0x50].
                        super_AlignedCharArray<1UL,_1UL> !=
              *(long *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x58)) {
            std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
                      ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       local_1c8,
                       (vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       ((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x50));
            uVar10 = local_1c8._8_8_;
            uVar9 = local_1c8._0_8_;
            if (local_1c8._0_8_ != local_1c8._8_8_) {
              lVar34 = local_1c8._8_8_ - local_1c8._0_8_;
              uVar22 = lVar34 >> 3;
              lVar20 = 0x3f;
              if (uVar22 != 0) {
                for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar34 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (uVar9,uVar10);
              }
              else {
                pbVar23 = (basic *)(uVar9 + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (uVar9,pbVar23);
                for (; pbVar23 != (basic *)uVar10; pbVar23 = pbVar23 + 8) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                            (pbVar23);
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  \"default_targets\": [",0x16);
            uVar9 = local_1c8._8_8_;
            for (pbVar23 = (basic *)local_1c8._0_8_; pbVar23 != (basic *)uVar9;
                pbVar23 = pbVar23 + 8) {
              if (pbVar23 != (basic *)local_1c8._0_8_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_218.first,(basic *)(*(long *)pbVar23 + 0x20),in_05);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
            if ((basic *)local_1c8._0_8_ != (basic *)0x0) {
              operator_delete((void *)local_1c8._0_8_,
                              local_1b8._M_allocated_capacity - local_1c8._0_8_);
            }
          }
          std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
                    ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)local_1c8,
                     (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)((local_1a0->buildCommand).super_SmallVector<char,_10240U>.
                         super_SmallVectorStorage<char,_10240U>.InlineElts + 0x18));
          uVar10 = local_1c8._8_8_;
          uVar9 = local_1c8._0_8_;
          if (local_1c8._0_8_ != local_1c8._8_8_) {
            lVar34 = local_1c8._8_8_ - local_1c8._0_8_;
            uVar22 = lVar34 >> 3;
            lVar20 = 0x3f;
            if (uVar22 != 0) {
              for (; uVar22 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                      (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar34 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (uVar9,uVar10);
            }
            else {
              pbVar23 = (basic *)(uVar9 + 0x80);
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (uVar9,pbVar23);
              for (; pbVar23 != (basic *)uVar10; pbVar23 = pbVar23 + 8) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (pbVar23);
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"commands\": [\n",0x10);
          local_178.field_2._8_8_ = local_1c8._8_8_;
          pbVar23 = (basic *)local_1c8._0_8_;
          if (local_1c8._0_8_ != local_1c8._8_8_) {
            do {
              lVar20 = *(long *)pbVar23;
              local_1d0 = pbVar23;
              if (pbVar23 != (basic *)local_1c8._0_8_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    {\n",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"outputs\": [",0x12);
              plVar31 = *(long **)(lVar20 + 0x18);
              for (plVar33 = *(long **)(lVar20 + 0x10); plVar33 != plVar31; plVar33 = plVar33 + 1) {
                if (plVar33 != *(long **)(lVar20 + 0x10)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          (&local_218.first,(basic *)(*plVar33 + 0x20),in_06);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"rule\": \"",0xf);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)**(undefined8 **)(lVar20 + 8),
                                   (*(undefined8 **)(lVar20 + 8))[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\",\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"inputs\": [",0x11);
              if ((ulong)*(uint *)(lVar20 + 0x40) != 0) {
                plVar33 = *(long **)(lVar20 + 0x28);
                lVar34 = (ulong)*(uint *)(lVar20 + 0x40) << 3;
                do {
                  if (plVar33 != *(long **)(lVar20 + 0x28)) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2)
                    ;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                  llbuild::basic::escapeForJSON<std::__cxx11::string>
                            (&local_218.first,(basic *)(*plVar33 + 0x20),in_07);
                  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                       local_218.first._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                    operator_delete(local_218.first._M_dataplus._M_p,
                                    local_218.first.field_2._M_allocated_capacity + 1);
                  }
                  plVar33 = plVar33 + 1;
                  lVar34 = lVar34 + -8;
                } while (lVar34 != 0);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              if (*(int *)(lVar20 + 0x44) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"implicit_inputs\": [",0x1a);
                if ((ulong)*(uint *)(lVar20 + 0x44) != 0) {
                  plVar33 = (long *)((ulong)*(uint *)(lVar20 + 0x40) * 8 + *(long *)(lVar20 + 0x28))
                  ;
                  lVar34 = (ulong)*(uint *)(lVar20 + 0x44) << 3;
                  do {
                    if (plVar33 !=
                        (long *)((ulong)*(uint *)(lVar20 + 0x40) * 8 + *(long *)(lVar20 + 0x28))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,", ",2);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1)
                    ;
                    llbuild::basic::escapeForJSON<std::__cxx11::string>
                              (&local_218.first,(basic *)(*plVar33 + 0x20),in_08);
                    poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                         local_218.first._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                      operator_delete(local_218.first._M_dataplus._M_p,
                                      local_218.first.field_2._M_allocated_capacity + 1);
                    }
                    plVar33 = plVar33 + 1;
                    lVar34 = lVar34 + -8;
                  } while (lVar34 != 0);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              }
              if ((int)((ulong)(*(long *)(lVar20 + 0x30) - *(long *)(lVar20 + 0x28)) >> 3) !=
                  *(int *)(lVar20 + 0x44) + *(int *)(lVar20 + 0x40)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"order_only_inputs\": [",0x1c);
                plVar31 = *(long **)(lVar20 + 0x30);
                for (plVar33 = (long *)((ulong)*(uint *)(lVar20 + 0x40) * 8 +
                                        *(long *)(lVar20 + 0x28) +
                                       (ulong)*(uint *)(lVar20 + 0x44) * 8); plVar33 != plVar31;
                    plVar33 = plVar33 + 1) {
                  if (plVar33 !=
                      (long *)((ulong)*(uint *)(lVar20 + 0x40) * 8 + *(long *)(lVar20 + 0x28) +
                              (ulong)*(uint *)(lVar20 + 0x44) * 8)) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2)
                    ;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                  llbuild::basic::escapeForJSON<std::__cxx11::string>
                            (&local_218.first,(basic *)(*plVar33 + 0x20),in_09);
                  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                       local_218.first._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                    operator_delete(local_218.first._M_dataplus._M_p,
                                    local_218.first.field_2._M_allocated_capacity + 1);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              }
              if ((*(byte *)(lVar20 + 0x110) & 4) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"generator\": true,\n",0x19);
              }
              if ((*(byte *)(lVar20 + 0x110) & 8) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"restat\": true,\n",0x16);
              }
              pbVar23 = *(basic **)(lVar20 + 0x68);
              if (pbVar23 != (basic *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"pool\": \"",0xf);
                llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_218.first,pbVar23,in_10);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\",\n",3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              pbVar29 = local_1d0;
              bVar17 = *(byte *)(lVar20 + 0x110) & 3;
              if (bVar17 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"deps\": \"msvc\",\n",0x16);
                pbVar29 = local_1d0;
              }
              else if (bVar17 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"deps\": \"gcc\",\n",0x15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"depfile\": \"",0x12);
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          (&local_218.first,(basic *)(lVar20 + 0xb0),in_11);
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                     local_218.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\",\n",3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                  operator_delete(local_218.first._M_dataplus._M_p,
                                  local_218.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"command\": \"",0x12);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_218.first,(basic *)(lVar20 + 0x70),in_12);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\",\n",3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"description\": \"",0x16);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_218.first,(basic *)(lVar20 + 0x90),in_13);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_218.first._M_dataplus._M_p,
                                   local_218.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\"\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
                operator_delete(local_218.first._M_dataplus._M_p,
                                local_218.first.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    }",5);
              pbVar23 = pbVar29 + 8;
            } while (pbVar29 + 8 != (basic *)local_178.field_2._8_8_);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  ]\n",5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
          if ((basic *)local_1c8._0_8_ != (basic *)0x0) {
            operator_delete((void *)local_1c8._0_8_,
                            local_1b8._M_allocated_capacity - local_1c8._0_8_);
          }
          if ((basic *)local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start != (basic *)0x0) {
            operator_delete(local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          this = &local_178;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
      }
      if (local_138._M_head_impl != (ManifestLoaderImpl *)0x0) {
        std::default_delete<llbuild::ninja::Manifest>::operator()
                  ((default_delete<llbuild::ninja::Manifest> *)&local_138,
                   (Manifest *)local_138._M_head_impl);
      }
      llbuild::ninja::ManifestLoader::~ManifestLoader(&local_f0);
      llbuild::ninja::ManifestLoaderActions::~ManifestLoaderActions(&local_58);
      if (local_110 != &local_100) {
        operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
      }
      iVar18 = 0;
    }
    else {
      executeLoadManifestCommand();
      iVar18 = 1;
    }
    if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_d8
       ) {
      free(local_e8.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    }
  }
  else {
    executeLoadManifestCommand();
LAB_00122bab:
    iVar18 = 1;
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  return iVar18;
}

Assistant:

static int executeLoadManifestCommand(const std::vector<std::string>& args,
                                      bool loadOnly) {
  // Parse options.
  bool json = false;
  auto it = args.begin();
  for (; it != args.end() && StringRef(*it).startswith("-"); ++it) {
    auto arg = *it;

    if (arg == "--json") {
      json = true;
    } else {
      fprintf(stderr, "error: %s: unknown option: '%s'\n",
              getProgramName(), arg.c_str());
      return 1;
    }
  }
  if (it == args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  std::string filename = *it++;
  if (it != args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  // Change to the directory containing the input file, so include references
  // can be relative.
  //
  // FIXME: Need llvm::sys::fs.
  size_t pos = filename.find_last_of('/');
  if (pos != std::string::npos) {
    if (!sys::chdir(filename.substr(0, pos).c_str())) {
      fprintf(stderr, "error: %s: unable to chdir(): %s\n",
              getProgramName(), sys::strerror(errno).c_str());
      return 1;
    }
    filename = filename.substr(pos+1);
  }

  SmallString<128> current_dir;
  if (std::error_code ec = llvm::sys::fs::current_path(current_dir)) {
    fprintf(stderr, "%s: error: cannot determine current directory\n",
            getProgramName());
    return 1;
  }
  const std::string workingDirectory = current_dir.str();

  LoadManifestActions actions;
  ninja::ManifestLoader loader(workingDirectory, filename, actions);
  std::unique_ptr<ninja::Manifest> manifest = loader.load();

  // If only loading, we are done.
  if (loadOnly)
    return 0;

  if (json) {
    dumpNinjaManifestJSON(filename, manifest.get());
  } else {
    dumpNinjaManifestText(filename, manifest.get());
  }

  return 0;
}